

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_error(AMQP_VALUE value,ERROR_HANDLE *error_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_58;
  fields info;
  char *description;
  char *condition;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  ERROR_INSTANCE *error_instance;
  ERROR_HANDLE *ppEStack_18;
  int result;
  ERROR_HANDLE *error_handle_local;
  AMQP_VALUE value_local;
  
  ppEStack_18 = error_handle;
  error_handle_local = (ERROR_HANDLE *)value;
  list_value = (AMQP_VALUE)error_create_internal();
  *ppEStack_18 = (ERROR_HANDLE)list_value;
  if (*ppEStack_18 == (ERROR_HANDLE)0x0) {
    error_instance._4_4_ = 0xe5;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)error_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      error_destroy(*ppEStack_18);
      error_instance._4_4_ = 0xed;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          error_instance._4_4_ = 0x121;
        }
        else {
          condition = (char *)amqpvalue_get_list_item(pAStack_30,0);
          if ((AMQP_VALUE)condition == (AMQP_VALUE)0x0) {
            error_destroy(*ppEStack_18);
            error_instance._4_4_ = 0x103;
          }
          else {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)condition);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy((AMQP_VALUE)condition);
              error_destroy(*ppEStack_18);
              error_instance._4_4_ = 0x10d;
            }
            else {
              iVar1 = amqpvalue_get_symbol((AMQP_VALUE)condition,&description);
              if (iVar1 == 0) {
                amqpvalue_destroy((AMQP_VALUE)condition);
                if ((1 < item_value._4_4_) &&
                   (condition = (char *)amqpvalue_get_list_item(pAStack_30,1),
                   (AMQP_VALUE)condition != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)condition);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_string((AMQP_VALUE)condition,(char **)&info), iVar1 != 0
                     )) {
                    amqpvalue_destroy((AMQP_VALUE)condition);
                    error_destroy(*ppEStack_18);
                    return 0x139;
                  }
                  amqpvalue_destroy((AMQP_VALUE)condition);
                }
                if ((2 < item_value._4_4_) &&
                   (condition = (char *)amqpvalue_get_list_item(pAStack_30,2),
                   (AMQP_VALUE)condition != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type((AMQP_VALUE)condition);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_map((AMQP_VALUE)condition,&local_58), iVar1 != 0)) {
                    amqpvalue_destroy((AMQP_VALUE)condition);
                    error_destroy(*ppEStack_18);
                    return 0x156;
                  }
                  amqpvalue_destroy((AMQP_VALUE)condition);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)error_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                error_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy((AMQP_VALUE)condition);
                error_destroy(*ppEStack_18);
                error_instance._4_4_ = 0x117;
              }
            }
          }
        }
      }
      else {
        error_instance._4_4_ = 0xf4;
      }
    }
  }
  return error_instance._4_4_;
}

Assistant:

int amqpvalue_get_error(AMQP_VALUE value, ERROR_HANDLE* error_handle)
{
    int result;
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error_create_internal();
    *error_handle = error_instance;
    if (*error_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            error_destroy(*error_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* condition */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                error_destroy(*error_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                error_destroy(*error_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* condition;
                                if (amqpvalue_get_symbol(item_value, &condition) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* description */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* description;
                                if (amqpvalue_get_string(item_value, &description) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* info */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields info;
                                if (amqpvalue_get_fields(item_value, &info) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    error_destroy(*error_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    error_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}